

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_inexact_to_exact(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  sexp_tag_t sVar1;
  sexp psVar2;
  sexp psVar3;
  sexp psVar4;
  sexp_sint_t n_00;
  sexp_sint_t n_01;
  double dVar5;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_50;
  sexp_gc_var_t local_48;
  double local_38;
  undefined8 uStack_30;
  
  local_50 = (sexp)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  if (((ulong)z & 1) != 0) {
    return z;
  }
  if (((ulong)z & 2) == 0) {
    sVar1 = z->tag;
    if (sVar1 - 0xc < 2) {
      return z;
    }
    if (sVar1 == 0xb) {
      local_38 = (z->value).flonum;
      if (0x7fefffffffffffff < (ulong)ABS(local_38)) {
        psVar3 = sexp_xtype_exception(ctx,self,"exact: not a finite number",z);
        return psVar3;
      }
      uStack_30 = 0;
      dVar5 = trunc(local_38);
      if ((local_38 == dVar5) && (!NAN(local_38) && !NAN(dVar5))) {
        if (4.611686018427388e+18 < ABS(local_38)) {
          psVar3 = sexp_double_to_bignum(ctx,local_38);
          return psVar3;
        }
        return (sexp)((long)local_38 * 2 + 1);
      }
      psVar3 = sexp_double_to_ratio_2(ctx,local_38);
      return psVar3;
    }
    if (sVar1 == 0xe) {
      local_48.var = &local_50;
      local_48.next = (ctx->value).context.saves;
      (ctx->value).context.saves = &local_48;
      local_50 = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_00000001);
      psVar3 = sexp_inexact_to_exact(ctx,self,n_00,(z->value).type.name);
      (local_50->value).type.name = psVar3;
      psVar4 = sexp_inexact_to_exact(ctx,self,n_01,(z->value).type.cpl);
      (local_50->value).type.cpl = psVar4;
      psVar3 = (local_50->value).type.name;
      if (((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 0x13)) ||
         (((((ulong)psVar4 & 3) != 0 || (psVar2 = psVar4, psVar4->tag != 0x13)) &&
          (psVar2 = local_50, psVar4 == (sexp)&DAT_00000001)))) {
        psVar2 = psVar3;
      }
      local_50 = psVar2;
      (ctx->value).context.saves = local_48.next;
      return local_50;
    }
  }
  psVar3 = sexp_type_exception(ctx,self,0xb,z);
  return psVar3;
}

Assistant:

sexp sexp_inexact_to_exact (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
  sexp_gc_var1(res);
  if (sexp_exactp(z)) {
    res = z;
  }
#if SEXP_USE_FLONUMS
  else if (sexp_flonump(z)) {
    if (isinf(sexp_flonum_value(z)) || isnan(sexp_flonum_value(z))) {
      res = sexp_xtype_exception(ctx, self, "exact: not a finite number", z);
    } else if (sexp_flonum_value(z) != trunc(sexp_flonum_value(z))) {
#if SEXP_USE_RATIOS
      res = sexp_double_to_ratio_2(ctx, sexp_flonum_value(z));
#else
      res = sexp_xtype_exception(ctx, self, "exact: not an integer", z);
#endif
#if SEXP_USE_BIGNUMS
    } else if ((sexp_flonum_value(z) > (double)SEXP_MAX_FIXNUM)
               || sexp_flonum_value(z) < (double)SEXP_MIN_FIXNUM) {
      res = sexp_double_to_bignum(ctx, sexp_flonum_value(z));
#endif
    } else {
      res = sexp_make_fixnum((sexp_sint_t)sexp_flonum_value(z));
    }
  }
#endif
#if SEXP_USE_COMPLEX
  else if (sexp_complexp(z)) {
    sexp_gc_preserve1(ctx, res);
    res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
    sexp_complex_real(res) = sexp_inexact_to_exact(ctx, self, 1, sexp_complex_real(z));
    sexp_complex_imag(res) = sexp_inexact_to_exact(ctx, self, 1, sexp_complex_imag(z));
    if (sexp_exceptionp(sexp_complex_real(res)))
      res = sexp_complex_real(res);
    else if (sexp_exceptionp(sexp_complex_imag(res)))
      res = sexp_complex_imag(res);
    else if (sexp_complex_imag(res) == SEXP_ZERO)
      res = sexp_complex_real(res);
    sexp_gc_release1(ctx);
  }
#endif
  else {
    res = sexp_type_exception(ctx, self, SEXP_FLONUM, z);
  }
  return res;
}